

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)>::Action
          (Action<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)> *this,
          ActionInterface<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)>
          *impl)

{
  ActionAdapter local_28;
  ActionInterface<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)> *local_18
  ;
  ActionInterface<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)>
  *impl_local;
  Action<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)>
                *)this;
  std::
  shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::CommissionerDataset_const&)>>
  ::
  shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::CommissionerDataset_const&)>,void>
            ((shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::CommissionerDataset_const&)>>
              *)&local_28,impl);
  std::function<ot::commissioner::Error(ot::commissioner::CommissionerDataset_const&)>::
  function<testing::Action<ot::commissioner::Error(ot::commissioner::CommissionerDataset_const&)>::ActionAdapter,void>
            ((function<ot::commissioner::Error(ot::commissioner::CommissionerDataset_const&)> *)this
             ,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}